

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascFiles.cpp
# Opt level: O0

TCHAR * AppendBlobText(TCHAR *szBuffer,LPBYTE pbData,size_t cbData,TCHAR chSeparator)

{
  uchar *puVar1;
  ulong local_30;
  size_t i;
  TCHAR chSeparator_local;
  size_t cbData_local;
  LPBYTE pbData_local;
  TCHAR *szBuffer_local;
  
  pbData_local = (LPBYTE)szBuffer;
  if (chSeparator != '\0') {
    pbData_local = (LPBYTE)(szBuffer + 1);
    *szBuffer = chSeparator;
  }
  cbData_local = (size_t)pbData;
  for (local_30 = 0; local_30 < cbData; local_30 = local_30 + 1) {
    puVar1 = pbData_local + 1;
    *pbData_local = IntToHexChar[(int)(uint)*(byte *)cbData_local >> 4];
    pbData_local = pbData_local + 2;
    *puVar1 = IntToHexChar[(int)(*(byte *)cbData_local & 0xf)];
    cbData_local = cbData_local + 1;
  }
  *pbData_local = '\0';
  return (TCHAR *)pbData_local;
}

Assistant:

TCHAR * AppendBlobText(TCHAR * szBuffer, LPBYTE pbData, size_t cbData, TCHAR chSeparator)
{
    // Put the separator, if any
    if(chSeparator != 0)
        *szBuffer++ = chSeparator;

    // Copy the blob data as text
    for(size_t i = 0; i < cbData; i++)
    {
        *szBuffer++ = IntToHexChar[pbData[0] >> 0x04];
        *szBuffer++ = IntToHexChar[pbData[0] & 0x0F];
        pbData++;
    }

    // Terminate the string
    *szBuffer = 0;

    // Return new buffer position
    return szBuffer;
}